

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test_cryptoutil.cpp
# Opt level: O2

void __thiscall
CryptoUtil_EncryptAes256String19_Test::~CryptoUtil_EncryptAes256String19_Test
          (CryptoUtil_EncryptAes256String19_Test *this)

{
  testing::Test::~Test(&this->super_Test);
  operator_delete(this);
  return;
}

Assistant:

TEST(CryptoUtil, EncryptAes256String19) {
  ByteData key(
      "616975656F616975656F616975656F616975656F616975656F616975656F6169");
  ByteData byte_data = CryptoUtil::EncryptAes256(key.GetBytes(),
                                                 "test test test test");
  EXPECT_STREQ(
      byte_data.GetHex().c_str(),
      "752fe203af4a4d427997e5d2c8b246530e0546b66d2982a49e333e77295dccea");
}